

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  bool bVar1;
  reference ppEVar2;
  pointer this_00;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar3;
  ExpectationBase *next;
  const_iterator it;
  ExpectationBase *exp;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationSet *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  allocator_type *in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  *in_stack_ffffffffffffff80;
  MutexBase *in_stack_ffffffffffffff90;
  _Self local_60;
  _Self local_58;
  value_type local_50;
  
  MutexBase::AssertHeld(in_stack_ffffffffffffff90);
  std::allocator<const_testing::internal::ExpectationBase_*>::allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)0x11161e9);
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
           (value_type *)in_stack_ffffffffffffff70._M_node,in_stack_ffffffffffffff68);
  std::allocator<const_testing::internal::ExpectationBase_*>::~allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)0x1116211);
  while (bVar1 = std::
                 vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 ::empty((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                          *)in_stack_ffffffffffffff70._M_node), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar2 = std::
              vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ::back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                      *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    local_50 = *ppEVar2;
    std::
    vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ::pop_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                *)0x111624d);
    local_58._M_node = (_Base_ptr)ExpectationSet::begin(in_stack_ffffffffffffff58);
    while( true ) {
      in_stack_ffffffffffffff70 = ExpectationSet::end(in_stack_ffffffffffffff58);
      local_60._M_node = in_stack_ffffffffffffff70._M_node;
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                          ((_Rb_tree_const_iterator<testing::Expectation> *)0x11162ad);
      this_01 = &Expectation::expectation_base(this_00)->
                 super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
      peVar3 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
               get(this_01);
      in_stack_ffffffffffffff67 =
           IsSatisfied((ExpectationBase *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      if ((bool)in_stack_ffffffffffffff67) {
        if (peVar3->call_count_ == 0) {
          std::
          vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
          ::push_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                       *)in_stack_ffffffffffffff70._M_node,&this_01->_M_ptr);
        }
      }
      else {
        std::_Rb_tree_const_iterator<testing::Expectation>::operator*
                  ((_Rb_tree_const_iterator<testing::Expectation> *)0x111634c);
        ExpectationSet::operator+=
                  ((ExpectationSet *)in_stack_ffffffffffffff70._M_node,(Expectation *)this_01);
      }
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++
                ((_Rb_tree_const_iterator<testing::Expectation> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    }
  }
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::~vector((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
             *)in_stack_ffffffffffffff70._M_node);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();

      if (next->IsSatisfied()) {
        // If *it is satisfied and has a call count of 0, some of its
        // pre-requisites may not be satisfied yet.
        if (next->call_count_ == 0) {
          expectations.push_back(next);
        }
      } else {
        // Now that we know next is unsatisfied, we are not so interested
        // in whether its pre-requisites are satisfied.  Therefore we
        // don't iterate into it here.
        *result += *it;
      }
    }
  }
}